

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cpp
# Opt level: O3

bool vera::loadPLY(string *_filename,Scene *_scene,bool _verbose)

{
  pointer pvVar1;
  pointer pcVar2;
  pointer *ppvVar3;
  mapped_type pMVar4;
  vec<2,_float,_(glm::qualifier)0> vVar5;
  Scene *pSVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  iterator iVar11;
  Material *this;
  mapped_type *ppMVar12;
  ostream *poVar13;
  istream *piVar14;
  long lVar15;
  undefined8 extraout_RAX;
  Model *this_00;
  mapped_type *ppMVar16;
  long *plVar17;
  char *pcVar18;
  size_type *psVar19;
  bool bVar20;
  int iVar21;
  byte bVar22;
  int iVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  vec<4,_float,_(glm::qualifier)0> vVar26;
  int colorCompsFound;
  int normalsCoordsFound;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vertices;
  vec3 n;
  float a;
  vec3 v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  float b;
  float g;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  colors;
  string error;
  string line;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texcoord;
  string name;
  Mesh mesh;
  stringstream sline;
  fstream is;
  int local_608;
  int local_604;
  uint local_600;
  int local_5fc;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_5f8;
  string *local_5d8;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_5d0;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_5cc;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [16];
  long local_5b0;
  undefined4 local_5a4;
  ios_base *local_5a0;
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_578;
  ulong local_560;
  ulong local_558;
  ulong local_550;
  MaterialsMap *local_548;
  undefined4 local_540;
  undefined4 local_53c;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_538;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  local_518;
  char *local_4f8;
  char *local_4f0;
  char local_4e8 [16];
  char *local_4d8;
  long local_4d0;
  char local_4c8 [16];
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_4b8;
  string local_4a0;
  mapped_type local_480;
  Scene *local_478;
  Mesh local_470;
  undefined1 local_3c8 [128];
  ios_base local_348 [264];
  long local_240 [66];
  
  std::fstream::fstream(local_240,(_filename->_M_dataplus)._M_p,_S_in);
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 != '\0') {
    pcVar2 = local_3c8 + 0x10;
    local_3c8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"default","");
    local_548 = &_scene->materials;
    iVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
             ::find(&local_548->_M_t,(key_type *)local_3c8);
    if ((pointer)local_3c8._0_8_ != pcVar2) {
      operator_delete((void *)local_3c8._0_8_);
    }
    if ((_Rb_tree_header *)iVar11._M_node == &(_scene->materials)._M_t._M_impl.super__Rb_tree_header
       ) {
      this = (Material *)operator_new(0x150);
      local_3c8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"default","");
      Material::Material(this,(string *)local_3c8);
      ppvVar3 = &local_470.m_colors.
                 super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_470._vptr_Mesh = (_func_int **)ppvVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"default","");
      ppMVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                 ::operator[](local_548,(key_type *)&local_470);
      *ppMVar12 = this;
      if ((pointer *)local_470._vptr_Mesh != ppvVar3) {
        operator_delete(local_470._vptr_Mesh);
      }
      if ((pointer)local_3c8._0_8_ != pcVar2) {
        operator_delete((void *)local_3c8._0_8_);
      }
    }
    local_3c8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"default","");
    ppMVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
               ::operator[](local_548,(key_type *)local_3c8);
    pMVar4 = *ppMVar12;
    if ((pointer)local_3c8._0_8_ != pcVar2) {
      operator_delete((void *)local_3c8._0_8_);
    }
    Mesh::Mesh(&local_470);
    local_4d8 = local_4c8;
    local_4d0 = 0;
    local_4c8[0] = '\0';
    local_4f8 = local_4e8;
    local_4f0 = (char *)0x0;
    local_4e8[0] = '\0';
    local_608 = 0;
    local_604 = 0;
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    local_4a0._M_string_length = 0;
    local_4a0.field_2._M_local_buf[0] = '\0';
    local_518.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_518.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_518.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5f8.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_5f8.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5f8.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_538.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_538.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_538.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4b8.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4b8.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4b8.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    cVar7 = std::ios::widen((char)local_240 + (char)*(undefined8 *)(local_240[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_240,(string *)&local_4d8,cVar7);
    iVar8 = std::__cxx11::string::compare((char *)&local_4d8);
    if (iVar8 == 0) {
      cVar7 = std::ios::widen((char)(istream *)local_240 +
                              (char)*(undefined8 *)(local_240[0] + -0x18));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_240,(string *)&local_4d8,cVar7);
      iVar8 = std::__cxx11::string::compare((char *)&local_4d8);
      if (iVar8 != 0) {
        iVar8 = 2;
        std::__cxx11::string::_M_replace((ulong)&local_4f8,0,local_4f0,0x30e7b0);
        goto LAB_002adb0e;
      }
      local_5a0 = local_348;
      local_558 = 0;
      iVar10 = -1;
      iVar23 = -1;
      iVar8 = 3;
      iVar21 = -1;
      local_5fc = 0;
      local_550 = 0;
      local_560 = 0;
      local_600 = 0;
      bVar22 = 0;
      local_5d8 = _filename;
      local_480 = pMVar4;
      local_478 = _scene;
      while( true ) {
        cVar7 = std::ios::widen((char)*(undefined8 *)(local_240[0] + -0x18) + (char)local_240);
        piVar14 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_240,(string *)&local_4d8,cVar7);
        if (((byte)piVar14[*(long *)(*(long *)piVar14 + -0x18) + 0x20] & 5) != 0) break;
        lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e7db,0);
        if (lVar15 == 0) goto LAB_002ae6b6;
        if (((bVar22 & 0xfd) == 0) &&
           (lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e7e3,0), lVar15 == 0)) {
          iVar23 = 0;
          if (0 < iVar21) {
            iVar23 = iVar21;
          }
          std::__cxx11::string::substr((ulong)local_3c8,(ulong)&local_4d8);
          iVar10 = toInt((string *)local_3c8);
          std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::resize(&local_5f8,(long)iVar10);
          if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
            operator_delete((void *)local_3c8._0_8_);
          }
          iVar23 = iVar23 + 1;
          iVar10 = iVar23;
          goto LAB_002ae523;
        }
        if (bVar22 < 2) {
          lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e7f2,0);
          if (lVar15 == 0) {
            iVar21 = 0;
            if (0 < iVar23) {
              iVar21 = iVar23;
            }
            std::__cxx11::string::substr((ulong)local_3c8,(ulong)&local_4d8);
            iVar9 = toInt((string *)local_3c8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      (&local_578,(long)(iVar9 * 3));
            if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
              operator_delete((void *)local_3c8._0_8_);
            }
            iVar21 = iVar21 + 1;
            bVar22 = 2;
          }
          else {
            if (bVar22 != 1) goto LAB_002ae105;
            lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e7ff,0);
            if (((lVar15 == 0) ||
                (lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e810,0), lVar15 == 0))
               || (lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e821,0), lVar15 == 0))
            {
              local_558 = (ulong)((int)local_558 + 1);
LAB_002ae523:
              bVar22 = 1;
            }
            else {
              lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e832,0);
              if (((lVar15 == 0) ||
                  (lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e844,0), lVar15 == 0))
                 || (lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e856,0), lVar15 == 0
                    )) {
                local_604 = local_604 + 1;
                bVar22 = 1;
                if (local_604 == 3) {
                  std::
                  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ::resize(&local_538,
                           ((long)local_5f8.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_5f8.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 2) *
                           -0x5555555555555555);
                }
              }
              else {
                lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e868,0);
                if (((lVar15 == 0) ||
                    (lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e879,0), lVar15 == 0
                    )) || ((lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e88a,0),
                           lVar15 == 0 ||
                           (lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e89b,0),
                           lVar15 == 0)))) {
                  local_608 = local_608 + 1;
                  std::
                  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                  ::resize(&local_518,
                           ((long)local_5f8.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_5f8.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 2) *
                           -0x5555555555555555);
                  bVar22 = 1;
                  local_600 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                }
                else {
                  lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e8ac,0);
                  if ((((lVar15 != 0) &&
                       (lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e8bf,0),
                       lVar15 != 0)) &&
                      (lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e8d4,0),
                      lVar15 != 0)) &&
                     (lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e8e8,0),
                     lVar15 != 0)) {
                    lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e8fd,0);
                    if ((lVar15 == 0) ||
                       (lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e90e,0),
                       lVar15 == 0)) {
                      std::
                      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                      ::resize(&local_4b8,
                               ((long)local_5f8.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_5f8.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) *
                               -0x5555555555555555);
                    }
                    else {
                      lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e91f,0);
                      if ((lVar15 != 0) &&
                         (lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e938,0),
                         lVar15 != 0)) goto LAB_002ae105;
                      std::
                      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                      ::resize(&local_4b8,
                               ((long)local_5f8.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_5f8.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) *
                               -0x5555555555555555);
                    }
                    local_5fc = local_5fc + 1;
                    goto LAB_002ae523;
                  }
                  local_608 = local_608 + 1;
                  std::
                  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                  ::resize(&local_518,
                           ((long)local_5f8.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_5f8.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 2) *
                           -0x5555555555555555);
                  bVar22 = 1;
                  local_600 = 0;
                }
              }
            }
          }
        }
        else {
          if (((bVar22 == 2) &&
              (lVar15 = std::__cxx11::string::find((char *)&local_4d8,0x30e951,0), lVar15 != 0)) &&
             (iVar9 = std::__cxx11::string::compare((char *)&local_4d8), iVar9 != 0)) {
            std::__cxx11::string::operator=((string *)&local_4f8,"wrong face definition");
            _filename = local_5d8;
            goto LAB_002adb0e;
          }
LAB_002ae105:
          iVar9 = std::__cxx11::string::compare((char *)&local_4d8);
          if (iVar9 == 0) {
            if ((local_518.
                 super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish ==
                 local_518.
                 super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) || (0xfffffffd < local_608 - 5U)) {
              if ((local_538.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish ==
                   local_538.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) || (local_604 == 3)) {
                if (local_5f8.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_5f8.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"ERROR glMesh, load(): mesh loaded from \"",0x28)
                  ;
                  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(local_5d8->_M_dataplus)._M_p,
                                       local_5d8->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,"\" has no vertices",0x11);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
                  std::ostream::put((char)poVar13);
                  std::ostream::flush();
                }
                bVar24 = iVar23 == -1;
                iVar23 = iVar10;
                if (bVar24) {
                  iVar23 = 9999;
                }
                if (iVar21 == -1) {
                  iVar21 = 9999;
                }
                bVar22 = (iVar21 <= iVar23) * '\x02' + 3;
                iVar10 = iVar23;
                goto LAB_002ae6b6;
              }
              toString<int>((string *)local_598,&local_604);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_5d0,
                             "data has normal coordiantes but not correct number of components. Found "
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_598);
              _filename = local_5d8;
              plVar17 = (long *)std::__cxx11::string::append((char *)&local_5d0);
            }
            else {
              toString<int>((string *)local_598,&local_608);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_5d0,
                             "data has color coordiantes but not correct number of components. Found "
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_598);
              _filename = local_5d8;
              plVar17 = (long *)std::__cxx11::string::append((char *)&local_5d0);
            }
            psVar19 = (size_type *)(plVar17 + 2);
            if ((size_type *)*plVar17 == psVar19) {
              local_3c8._16_8_ = *psVar19;
              local_3c8._24_8_ = plVar17[3];
              local_3c8._0_8_ = local_3c8 + 0x10;
            }
            else {
              local_3c8._16_8_ = *psVar19;
              local_3c8._0_8_ = (size_type *)*plVar17;
            }
            local_3c8._8_8_ = plVar17[1];
            *plVar17 = (long)psVar19;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_4f8,(string *)local_3c8);
            if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
              operator_delete((void *)local_3c8._0_8_);
            }
            if ((undefined1 *)CONCAT44(aStack_5cc,local_5d0) != local_5c0) {
              operator_delete((undefined1 *)CONCAT44(aStack_5cc,local_5d0));
            }
            if ((undefined1 *)CONCAT44(local_598._4_4_,local_598._0_4_) != local_588) {
              operator_delete((undefined1 *)CONCAT44(local_598._4_4_,local_598._0_4_));
            }
            goto LAB_002adb0e;
          }
          if (bVar22 == 5) {
            if (local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              bVar22 = 5;
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)local_3c8);
              std::__cxx11::stringbuf::str((string *)(local_3c8 + 0x18));
              std::istream::operator>>((string *)local_3c8,(int *)&local_5d0);
              local_5b0 = CONCAT44(local_5b0._4_4_,local_5d0);
              if (local_5d0 == (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3)
              {
                std::istream::operator>>(local_3c8,(int *)local_598);
                lVar15 = (long)((int)local_560 * 3);
                local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15] = local_598._0_4_;
                std::istream::operator>>(local_3c8,(int *)local_598);
                local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15 + 1] = local_598._0_4_;
                std::istream::operator>>(local_3c8,(int *)local_598);
                local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15 + 2] = local_598._0_4_;
                local_560 = (ulong)((int)local_560 + 1);
                bVar22 = (iVar21 <= iVar23 ||
                         (ulong)((long)local_578.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_578.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2) / 3 !=
                         local_560) * '\x02' + 3;
              }
              else {
                bVar22 = 5;
                std::__cxx11::string::_M_replace((ulong)&local_4f8,0,local_4f0,0x30ea6b);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_3c8);
              std::ios_base::~ios_base(local_5a0);
              _filename = local_5d8;
              if ((int)local_5b0 != 3) goto LAB_002adb0e;
            }
          }
          else if (bVar22 == 3) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_3c8);
            std::__cxx11::stringbuf::str((string *)(local_3c8 + 0x18));
            std::istream::_M_extract<float>((float *)local_3c8);
            std::istream::_M_extract<float>((float *)local_3c8);
            if (2 < (int)local_558) {
              std::istream::_M_extract<float>((float *)local_3c8);
            }
            lVar15 = (long)(int)local_550;
            local_5f8.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar15].field_2 =
                 (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_598._8_4_;
            local_5f8.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar15].field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_598._0_4_;
            local_5f8.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar15].field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_598._4_4_;
            local_5b0 = lVar15;
            if (0 < local_604) {
              std::istream::_M_extract<float>((float *)local_3c8);
              std::istream::_M_extract<float>((float *)local_3c8);
              std::istream::_M_extract<float>((float *)local_3c8);
              local_538.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar15].field_2 = aStack_5c8;
              local_538.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar15].field_0 =
                   (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_5d0;
              local_538.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar15].field_1 =
                   (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)aStack_5cc;
            }
            if (0 < local_608) {
              if ((local_600 & 1) == 0) {
                local_5a4 = 0x437f0000;
                std::istream::_M_extract<float>((float *)local_3c8);
                std::istream::_M_extract<float>((float *)local_3c8);
                std::istream::_M_extract<float>((float *)local_3c8);
                if (3 < local_608) {
                  std::istream::_M_extract<float>((float *)local_3c8);
                }
                auVar25._4_4_ = local_53c;
                auVar25._0_4_ = local_5d0;
                auVar25._12_4_ = local_5a4;
                auVar25._8_4_ = local_540;
                vVar26 = (vec<4,_float,_(glm::qualifier)0>)divps(auVar25,_DAT_002e4ef0);
                local_518.
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_5b0] = vVar26;
              }
              else {
                std::istream::_M_extract<float>((float *)local_3c8);
                std::istream::_M_extract<float>((float *)local_3c8);
                std::istream::_M_extract<float>((float *)local_3c8);
                if (3 < local_608) {
                  std::istream::_M_extract<float>((float *)local_3c8);
                }
                pvVar1 = local_518.
                         super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + local_5b0;
                pvVar1->field_0 =
                     (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_5d0;
                pvVar1->field_1 =
                     (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)aStack_5cc;
                pvVar1->field_2 =
                     (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)aStack_5c8;
                pvVar1->field_3 =
                     (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_5c4;
              }
            }
            if (0 < local_5fc) {
              std::istream::_M_extract<float>((float *)local_3c8);
              std::istream::_M_extract<float>((float *)local_3c8);
              vVar5.field_1 = aStack_5cc;
              vVar5.field_0 = local_5d0;
              local_4b8.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_5b0] = vVar5;
            }
            local_550 = (ulong)((int)local_550 + 1);
            bVar22 = (iVar23 < iVar21 &&
                     ((long)local_5f8.
                            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_5f8.
                            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 -
                     local_550 == 0) * '\x02' + 3;
            std::__cxx11::stringstream::~stringstream((stringstream *)local_3c8);
            std::ios_base::~ios_base(local_5a0);
          }
        }
LAB_002ae6b6:
        iVar8 = iVar8 + 1;
      }
      std::fstream::close();
      pSVar6 = local_478;
      pMVar4 = local_480;
      _filename = local_5d8;
      Mesh::addColors(&local_470,&local_518);
      Mesh::addVertices(&local_470,&local_5f8);
      Mesh::addTexCoords(&local_470,&local_4b8);
      if (local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_470.m_drawMode = POINTS;
      }
      else {
        Mesh::addIndices(&local_470,&local_578);
      }
      if (local_538.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_538.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        Mesh::computeNormals(&local_470);
      }
      else {
        Mesh::addNormals(&local_470,&local_538);
      }
      Mesh::computeTangents(&local_470);
      ppMVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                 ::operator[](local_548,&pMVar4->name);
      *ppMVar12 = pMVar4;
      if (local_470.m_drawMode == LINES) {
        pcVar18 = "lines";
      }
      else if (local_470.m_drawMode == POINTS) {
        pcVar18 = "points";
      }
      else {
        pcVar18 = "mesh";
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_4a0,0,(char *)local_4a0._M_string_length,(ulong)pcVar18);
      this_00 = (Model *)operator_new(0x2d8);
      Model::Model(this_00,&local_4a0,&local_470,pMVar4);
      ppMVar16 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                 ::operator[](&pSVar6->models,&local_4a0);
      *ppMVar16 = this_00;
      bVar24 = false;
    }
    else {
      iVar8 = 1;
      std::__cxx11::string::_M_replace((ulong)&local_4f8,0,local_4f0,0x30e781);
LAB_002adb0e:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR glMesh, load(): ",0x16);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,":",1);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,local_4f8,(long)local_4f0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR glMesh, load(): \"",0x17);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_4d8,local_4d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      bVar24 = true;
      std::ostream::flush();
    }
    if (local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_578.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4b8.
        super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4b8.
                      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_538.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_538.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_5f8.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5f8.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_518.
        super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_518.
                      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p);
    }
    if (local_4f8 != local_4e8) {
      operator_delete(local_4f8);
    }
    if (local_4d8 != local_4c8) {
      operator_delete(local_4d8);
    }
    Mesh::~Mesh(&local_470);
    bVar20 = true;
    if (!bVar24) goto LAB_002add1f;
  }
  std::fstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ERROR glMesh, can not load  ",0x1c);
  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(_filename->_M_dataplus)._M_p,
                       _filename->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  bVar20 = false;
LAB_002add1f:
  std::fstream::~fstream(local_240);
  return bVar20;
}

Assistant:

bool loadPLY(const std::string& _filename, Scene* _scene, bool _verbose) {    
    std::fstream is(_filename.c_str(), std::ios::in);
    if (is.is_open()) {

        if (_scene->materials.find("default") == _scene->materials.end())
            _scene->materials["default"] = new Material("default");
        
        Material* default_material = _scene->materials["default"];

        Mesh mesh;

        std::string line;
        std::string error;

        int orderVertices=-1;
        int orderIndices=-1;

        int vertexCoordsFound=0;
        int colorCompsFound=0;
        int texCoordsFound=0;
        int normalsCoordsFound=0;

        int currentVertex = 0;
        int currentFace = 0;

        bool floatColor = false;

        enum State{
            Header,
            VertexDef,
            FaceDef,
            Vertices,
            Normals,
            Faces
        };

        State state = Header;

        int lineNum = 0;

        std::string name;

        std::vector<glm::vec4> colors;
        std::vector<glm::vec3> vertices;
        std::vector<glm::vec3> normals;
        std::vector<glm::vec2> texcoord;
        std::vector<INDEX_TYPE> indices;

        std::getline(is,line);
        lineNum++;
        if (line!="ply") {
            error = "wrong format, expecting 'ply'";
            goto clean;
        }

        std::getline(is,line);
        lineNum++;
        if (line!="format ascii 1.0") {
            error = "wrong format, expecting 'format ascii 1.0'";
            goto clean;
        }

        while(std::getline(is,line)) {
            lineNum++;
            if (line.find("comment")==0) {
                continue;
            }

            if ((state==Header || state==FaceDef) && line.find("element vertex")==0) {
                state = VertexDef;
                orderVertices = glm::max(orderIndices, 0)+1;
                vertices.resize(toInt(line.substr(15)));
                continue;
            }

            if ((state==Header || state==VertexDef) && line.find("element face")==0) {
                state = FaceDef;
                orderIndices = glm::max(orderVertices, 0)+1;
                indices.resize(toInt(line.substr(13))*3);
                continue;
            }

            if (state==VertexDef && (line.find("property float x")==0 || line.find("property float y")==0 || line.find("property float z")==0)) {
                vertexCoordsFound++;
                continue;
            }

            if (state==VertexDef && (line.find("property float nx")==0 || line.find("property float ny")==0 || line.find("property float nz")==0)) {
                normalsCoordsFound++;
                if (normalsCoordsFound==3) normals.resize(vertices.size());
                continue;
            }

            if (state==VertexDef && (line.find("property float r")==0 || line.find("property float g")==0 || line.find("property float b")==0 || line.find("property float a")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = true;
                continue;
            }
            else if (state==VertexDef && (line.find("property uchar red")==0 || line.find("property uchar green")==0 || line.find("property uchar blue")==0 || line.find("property uchar alpha")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = false;
                continue;
            }

            if (state==VertexDef && (line.find("property float u")==0 || line.find("property float v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }
            else if (state==VertexDef && (line.find("property float texture_u")==0 || line.find("property float texture_v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }

            if (state==FaceDef && line.find("property list")!=0 && line!="end_header") {
                error = "wrong face definition";
                goto clean;
            }

            if (line=="end_header") {
                if (colors.size() && colorCompsFound!=3 && colorCompsFound!=4) {
                    error =  "data has color coordiantes but not correct number of components. Found " + toString(colorCompsFound) + " expecting 3 or 4";
                    goto clean;
                }
                if (normals.size() && normalsCoordsFound!=3) {
                    error = "data has normal coordiantes but not correct number of components. Found " + toString(normalsCoordsFound) + " expecting 3";
                    goto clean;
                }
                if (!vertices.size()) {
                    std::cout << "ERROR glMesh, load(): mesh loaded from \"" << _filename << "\" has no vertices" << std::endl;
                }
                if (orderVertices==-1) orderVertices=9999;
                if (orderIndices==-1) orderIndices=9999;

                if (orderVertices < orderIndices) {
                    state = Vertices;
                }
                else {
                    state = Faces;
                }
                continue;
            }

            if (state==Vertices) {
                std::stringstream sline;
                sline.str(line);
                glm::vec3 v;
                sline >> v.x;
                sline >> v.y;
                if ( vertexCoordsFound > 2) sline >> v.z;
                vertices[currentVertex] = v;

                if (normalsCoordsFound > 0) {
                    glm::vec3 n;
                    sline >> n.x;
                    sline >> n.y;
                    sline >> n.z;
                    normals[currentVertex] = n;
                }

                if (colorCompsFound > 0) {
                    if (floatColor) {
                        glm::vec4 c;
                        sline >> c.r;
                        sline >> c.g;
                        sline >> c.b;
                        if (colorCompsFound > 3) sline >> c.a;
                        colors[currentVertex] = c;
                    }
                    else {
                        float r, g, b, a = 255;
                        sline >> r;
                        sline >> g;
                        sline >> b;
                        if (colorCompsFound > 3) sline >> a;
                        colors[currentVertex] = glm::vec4(r/255.0, g/255.0, b/255.0, a/255.0);
                    }
                }

                if (texCoordsFound>0) {
                    glm::vec2 uv;
                    sline >> uv.x;
                    sline >> uv.y;
                    texcoord[currentVertex] = uv;
                }

                currentVertex++;
                if ((uint32_t)currentVertex==vertices.size()) {
                    if (orderVertices<orderIndices) {
                        state = Faces;
                    }
                    else{
                        state = Vertices;
                    }
                }
                continue;
            }

            if (state==Faces && indices.size() > 0) {
                std::stringstream sline;
                sline.str(line);
                int numV;
                sline >> numV;
                if (numV!=3) {
                    error = "face not a triangle";
                    goto clean;
                }
                int i;
                sline >> i;
                indices[currentFace*3] = i;
                sline >> i;
                indices[currentFace*3+1] = i;
                sline >> i;
                indices[currentFace*3+2] = i;

                currentFace++;
                if ((uint32_t)currentFace==indices.size()/3) {
                    if (orderVertices<orderIndices) {
                        state = Vertices;
                    }
                    else {
                        state = Faces;
                    }
                }
                continue;
            }
        }
        is.close();

        //  Succed loading the PLY data
        //  (proceed replacing the data on mesh)
        //
        mesh.addColors(colors);
        mesh.addVertices(vertices);
        mesh.addTexCoords(texcoord);

        if ( indices.size() > 0 ){
            mesh.addIndices( indices );
        }
        else {
            mesh.setDrawMode( POINTS );
        }
        
        if ( normals.size() > 0 ) {
            mesh.addNormals( normals );
        }
        else {
            mesh.computeNormals();
        }

        mesh.computeTangents();

        _scene->materials[default_material->name] = default_material;

        if (mesh.getDrawMode() == POINTS)
            name = "points";
        else if (mesh.getDrawMode() == LINES)
            name = "lines";
        else
            name = "mesh";
        _scene->models[name] = new Model(name, mesh, default_material);

        return true;

    clean:
        std::cout << "ERROR glMesh, load(): " << lineNum << ":" << error << std::endl;
        std::cout << "ERROR glMesh, load(): \"" << line << "\"" << std::endl;

    }

    is.close();
    std::cout << "ERROR glMesh, can not load  " << _filename << std::endl;

    return false;
}